

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrator.cpp
# Opt level: O0

void __thiscall pbrt::WavefrontPathIntegrator::StopDisplayThread(WavefrontPathIntegrator *this)

{
  WavefrontPathIntegrator *this_local;
  
  return;
}

Assistant:

void WavefrontPathIntegrator::StopDisplayThread() {
#ifdef PBRT_BUILD_GPU_RENDERER
    if (Options->useGPU) {
        // Wait until rendering is all done before we start to shut down the
        // display stuff..
        if (!Options->displayServer.empty()) {
            *exitCopyThread = true;
            copyThread->join();
            delete copyThread;
            copyThread = nullptr;
        }

        // Another synchronization to make sure no kernels are running on the
        // GPU so that we can safely access unified memory from the CPU.
        GPUWait();
    }
#endif  // PBRT_BUILD_GPU_RENDERER
}